

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<float,1,8,1,1,8>>::
redux<Eigen::internal::scalar_max_op<float,float,0>>
          (DenseBase<Eigen::Matrix<float,1,8,1,1,8>> *this,scalar_max_op<float,_float,_0> *func)

{
  bool bVar1;
  ThisEvaluator func_00;
  Index IVar2;
  Matrix<float,_1,_8,_1,_1,_8> *pMVar3;
  Scalar SVar4;
  redux_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> local_20;
  ThisEvaluator thisEval;
  scalar_max_op<float,_float,_0> *func_local;
  DenseBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> *this_local;
  
  thisEval.super_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>)
       (evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>)func;
  IVar2 = EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::rows
                    ((EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::cols
                      ((EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<float, 1, 8, 1, 1, 8>>::redux(const Func &) const [Derived = Eigen::Matrix<float, 1, 8, 1, 1, 8>, BinaryOp = Eigen::internal::scalar_max_op<float>]"
                 );
  }
  pMVar3 = EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> *)this);
  internal::redux_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::redux_evaluator(&local_20,pMVar3)
  ;
  func_00 = thisEval;
  pMVar3 = EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<float,1,8,1,1,8>>,3,2>
          ::run<Eigen::Matrix<float,1,8,1,1,8>>
                    (&local_20,
                     (scalar_max_op<float,_float,_0> *)
                     func_00.super_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>_>.
                     m_d.data,pMVar3);
  internal::redux_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::~redux_evaluator(&local_20);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}